

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O3

Result __thiscall wabt::ExprVisitor::VisitExprList(ExprVisitor *this,ExprList *exprs)

{
  Expr *root_expr;
  Result RVar1;
  Expr *expr;
  
  root_expr = exprs->first_;
  while( true ) {
    if (root_expr == (Expr *)0x0) {
      return (Result)Ok;
    }
    RVar1 = VisitExpr(this,root_expr);
    if (RVar1.enum_ == Error) break;
    root_expr = (root_expr->super_intrusive_list_base<wabt::Expr>).next_;
  }
  return (Result)Error;
}

Assistant:

Result ExprVisitor::VisitExprList(ExprList& exprs) {
  for (Expr& expr : exprs)
    CHECK_RESULT(VisitExpr(&expr));
  return Result::Ok;
}